

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O2

void LoadBookHashTable(void)

{
  _Alloc_hider fen;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  int buff_p;
  string line;
  string side;
  string move_s;
  int local_f4;
  char *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8 [32];
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  BookHashTable = (BookHashNode *)operator_new__(0x1800000);
  memset(BookHashTable,0,0x1800000);
  pcVar2 = (char *)operator_new__(0x1000000);
  memset(pcVar2,0,0x1000000);
  local_f4 = 0;
  local_f0 = pcVar2;
  decompress(pcVar2);
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  local_e8._M_string_length = 0;
  local_e8.field_2._M_local_buf[0] = '\0';
  while( true ) {
    bVar1 = getLine(local_f0,&local_f4,&local_e8);
    if (!bVar1) break;
    BookZobristKey = ZobristKey;
    BookZobristKeyCheck = ZobristKeyCheck;
    pcVar2 = (char *)operator_new__(local_e8._M_string_length + 1);
    strcpy(pcVar2,local_e8._M_dataplus._M_p);
    pcVar3 = strtok(pcVar2,":");
    std::__cxx11::string::string(local_a8,pcVar3,(allocator *)&local_c8);
    strtok((char *)0x0,anon_var_dwarf_16c57 + 0x25);
    std::__cxx11::string::assign((char *)&local_e8);
    pcVar3 = strtok((char *)0x0,anon_var_dwarf_16c57 + 0x25);
    std::__cxx11::string::string((string *)&local_c8,pcVar3,(allocator *)&local_48);
    std::operator+(&local_68,&local_e8,anon_var_dwarf_16c57 + 0x25);
    std::operator+(&local_48,&local_68,&local_c8);
    std::__cxx11::string::operator=((string *)&local_e8,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    operator_delete(pcVar2);
    fen._M_p = local_e8._M_dataplus._M_p;
    std::__cxx11::string::string((string *)&local_88,local_a8);
    FENToHash(fen._M_p,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string(local_a8);
  }
  operator_delete__(local_f0);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void LoadBookHashTable(){
    BookHashTable = new BookHashNode[BOOK_HASHTABLE_SIZE];
    memset(BookHashTable, 0, BOOK_HASHTABLE_SIZE * sizeof(BookHashNode));

    char* buff = new char[1<<24];
    memset(buff, 0, (1<<24) * sizeof(char));
    int buff_p = 0;
    decompress(buff);

    string line;
    while(getLine(buff, buff_p, line)){
        InitBookZobrist();
        char* temp = new char[line.size() + 1];
		strcpy(temp, line.c_str());
        string move_s = strtok(temp, ":");

		line = strtok(NULL, " ");
		string side = strtok(NULL, " ");
		line = line + " " + side;       // line存放FEN串
        delete temp;
        FENToHash(line.c_str(), move_s);                 // 将对应局面存入哈希表
    }
    delete[] buff;
}